

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::ArrayBuilder<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText>::~ArrayBuilder
          (ArrayBuilder<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText> *this)

{
  MethodText *pMVar1;
  RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText> *pRVar2;
  MethodText *pMVar3;
  
  pMVar1 = this->ptr;
  if (pMVar1 != (MethodText *)0x0) {
    pRVar2 = this->pos;
    pMVar3 = this->endPtr;
    this->ptr = (MethodText *)0x0;
    this->pos = (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText> *)0x0;
    this->endPtr = (MethodText *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pMVar1,0x118,((long)pRVar2 - (long)pMVar1 >> 3) * -0x5075075075075075,
               ((long)pMVar3 - (long)pMVar1 >> 3) * -0x5075075075075075,
               ArrayDisposer::Dispose_<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText>::
               destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }